

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O1

void __thiscall enact::ContinueStmt::~ContinueStmt(ContinueStmt *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__ContinueStmt_00129278;
  pcVar2 = (this->keyword).lexeme._M_dataplus._M_p;
  paVar1 = &(this->keyword).lexeme.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

~ContinueStmt() override = default;